

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void __thiscall FNotifyBuffer::Draw(FNotifyBuffer *this)

{
  FNotifyText *pFVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  FFont *font;
  DFrameBuffer *this_00;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  int iVar13;
  int y;
  long lVar14;
  uint i;
  ulong uVar15;
  double dVar16;
  
  bVar6 = con_centernotify.Value;
  if (1 < (uint)(gamestate + GS_FORCEWIPEBURN)) {
    y = this->Top;
    iVar8 = SmallFont->FontHeight;
    iVar7 = active_con_scaletext();
    iVar13 = CleanYfac;
    if (iVar7 != 0) {
      iVar13 = 1;
    }
    iVar13 = iVar13 * iVar8;
    BorderTopRefresh =
         (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])();
    bVar5 = true;
    lVar14 = 8;
    for (uVar15 = 0; uVar15 < (this->Text).Count; uVar15 = uVar15 + 1) {
      pFVar1 = (this->Text).Array;
      iVar8 = *(int *)((long)pFVar1 + lVar14 + -8);
      if (iVar8 != 0) {
        uVar11 = iVar8 - gametic;
        if (uVar11 == 0 || iVar8 < gametic) {
          if (bVar5) {
            this->Top = this->Top + iVar13;
            y = y + iVar13;
          }
          *(undefined4 *)((long)pFVar1 + lVar14 + -8) = 0;
        }
        else {
          iVar8 = *(int *)((long)pFVar1 + lVar14 + -4);
          if ((show_messages.Value != false) || (iVar8 == 0x80)) {
            dVar16 = (double)(int)uVar11 / 6.0;
            if (5 < uVar11) {
              dVar16 = 1.0;
            }
            iVar7 = 0xb;
            if (iVar8 < 5) {
              iVar7 = PrintColors[iVar8];
            }
            iVar8 = active_con_scaletext();
            this_00 = screen;
            font = SmallFont;
            if (iVar8 == 1) {
              if (bVar6) {
                iVar8 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                iVar9 = FFont::StringWidth(SmallFont,(FString *)((long)&pFVar1->TimeOut + lVar14));
                iVar8 = (iVar8 - iVar9) / 2;
                pcVar12 = *(char **)((long)&pFVar1->TimeOut + lVar14);
              }
              else {
                pcVar12 = *(char **)((long)&pFVar1->TimeOut + lVar14);
                iVar8 = 0;
              }
              DCanvas::DrawText((DCanvas *)this_00,font,iVar7,iVar8,y,pcVar12,0x4000138c,dVar16,0);
            }
            else if (iVar8 == 0) {
              if (bVar6) {
                iVar8 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                iVar9 = FFont::StringWidth(SmallFont,(FString *)((long)&pFVar1->TimeOut + lVar14));
                iVar8 = (iVar8 - iVar9 * CleanXfac) / 2;
                pcVar12 = *(char **)((long)&pFVar1->TimeOut + lVar14);
              }
              else {
                pcVar12 = *(char **)((long)&pFVar1->TimeOut + lVar14);
                iVar8 = 0;
              }
              DCanvas::DrawText((DCanvas *)this_00,font,iVar7,iVar8,y,pcVar12,0x40001393,dVar16,1,
                                0x4000138c,0);
            }
            else {
              if (bVar6) {
                iVar8 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
                iVar9 = FFont::StringWidth(SmallFont,(FString *)((long)&pFVar1->TimeOut + lVar14));
                iVar10 = active_con_scaletext();
                uVar2 = (long)(iVar8 - iVar9 * iVar10) / 2;
                pcVar12 = *(char **)((long)&pFVar1->TimeOut + lVar14);
                uVar3 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar10;
                uVar4 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)iVar10;
                iVar8 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff)
                             / (long)iVar10);
              }
              else {
                pcVar12 = *(char **)((long)&pFVar1->TimeOut + lVar14);
                uVar3 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Width / (long)iVar8;
                uVar4 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)iVar8;
                iVar8 = 0;
              }
              DCanvas::DrawText((DCanvas *)this_00,font,iVar7,iVar8,y,pcVar12,0x40001399,dVar16,
                                uVar3 & 0xffffffff,0x4000139a,uVar4 & 0xffffffff,0x400013a8,1,
                                0x4000138c,0);
            }
            y = y + iVar13;
            bVar5 = false;
          }
        }
      }
      lVar14 = lVar14 + 0x10;
    }
    if (bVar5) {
      this->Top = this->TopGoal;
    }
  }
  return;
}

Assistant:

void FNotifyBuffer::Draw()
{
	bool center = (con_centernotify != 0.f);
	int line, lineadv, color, j;
	bool canskip;
	
	if (gamestate == GS_FULLCONSOLE || gamestate == GS_DEMOSCREEN/* || menuactive != MENU_Off*/)
		return;

	line = Top;
	canskip = true;

	lineadv = SmallFont->GetHeight ();
	if (active_con_scaletext() == 0)
	{
		lineadv *= CleanYfac;
	}

	BorderTopRefresh = screen->GetPageCount ();

	for (unsigned i = 0; i < Text.Size(); ++ i)
	{
		FNotifyText &notify = Text[i];

		if (notify.TimeOut == 0)
			continue;

		j = notify.TimeOut - gametic;
		if (j > 0)
		{
			if (!show_messages && notify.PrintLevel != 128)
				continue;

			double alpha = (j < NOTIFYFADETIME) ? 1. * j / NOTIFYFADETIME : 1;

			if (notify.PrintLevel >= PRINTLEVELS)
				color = CR_UNTRANSLATED;
			else
				color = PrintColors[notify.PrintLevel];

			if (active_con_scaletext() == 0)
			{
				if (!center)
					screen->DrawText (SmallFont, color, 0, line, notify.Text,
						DTA_CleanNoMove, true, DTA_AlphaF, alpha, TAG_DONE);
				else
					screen->DrawText (SmallFont, color, (SCREENWIDTH -
						SmallFont->StringWidth (notify.Text)*CleanXfac)/2,
						line, notify.Text, DTA_CleanNoMove, true,
						DTA_AlphaF, alpha, TAG_DONE);
			}
			else if (active_con_scaletext() == 1)
			{
				if (!center)
					screen->DrawText (SmallFont, color, 0, line, notify.Text,
						DTA_AlphaF, alpha, TAG_DONE);
				else
					screen->DrawText (SmallFont, color, (SCREENWIDTH -
						SmallFont->StringWidth (notify.Text))/2,
						line, notify.Text,
						DTA_AlphaF, alpha, TAG_DONE);
			}
			else
			{
				if (!center)
					screen->DrawText (SmallFont, color, 0, line, notify.Text,
						DTA_VirtualWidth, screen->GetWidth() / active_con_scaletext(),
						DTA_VirtualHeight, screen->GetHeight() / active_con_scaletext(),
						DTA_KeepRatio, true,
						DTA_AlphaF, alpha, TAG_DONE);
				else
					screen->DrawText (SmallFont, color, (screen->GetWidth() -
						SmallFont->StringWidth (notify.Text) * active_con_scaletext()) / 2 / active_con_scaletext(),
						line, notify.Text,
						DTA_VirtualWidth, screen->GetWidth() / active_con_scaletext(),
						DTA_VirtualHeight, screen->GetHeight() / active_con_scaletext(),
						DTA_KeepRatio, true,
						DTA_AlphaF, alpha, TAG_DONE);
			}
			line += lineadv;
			canskip = false;
		}
		else
		{
			if (canskip)
			{
				Top += lineadv;
				line += lineadv;
			}
			notify.TimeOut = 0;
		}
	}
	if (canskip)
	{
		Top = TopGoal;
	}
}